

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField64.c
# Opt level: O0

void Hacl_GenericField64_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,uint64_t *aM,uint32_t bBits,
               uint64_t *b,uint64_t *resM)

{
  long lVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint32_t i_00;
  uint64_t *puVar6;
  ulong uVar7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint64_t uStack_2b0;
  uint64_t uStack_2a8;
  uint64_t *local_2a0;
  uint64_t *local_298;
  uint64_t *local_290;
  uint64_t *local_288;
  uint64_t *local_280;
  uint64_t *local_278;
  uint64_t *local_270;
  uint64_t *ctx_n_9;
  uint64_t *a_bits_l_1;
  uint64_t uStack_258;
  uint32_t bits_l32_1;
  uint64_t bits_l;
  uint64_t *puStack_248;
  uint32_t k2;
  uint64_t *ctx_n_13;
  uint64_t *ctx_n_12;
  uint64_t *ctx_n_11;
  uint64_t *ctx_n_10;
  uint32_t i0;
  uint32_t i_3;
  unsigned_long __vla_expr5;
  uint64_t *ctx_r2_1;
  uint64_t *ctx_n_8;
  uint64_t *a_bits_l;
  uint64_t uStack_1f8;
  uint32_t bits_l32;
  uint64_t bits_c;
  uint64_t *puStack_1e8;
  uint32_t i_2;
  uint64_t *ctx_n_7;
  uint64_t *t2_6;
  uint64_t *ctx_n1_6;
  uint64_t *t11_6;
  uint64_t *ctx_n_6;
  uint64_t *t2_5;
  uint64_t *ctx_n1_5;
  uint64_t *t11_5;
  uint64_t *ctx_n_5;
  uint64_t *t2_4;
  uint64_t *ctx_n1_4;
  uint64_t *t11_4;
  uint64_t *ctx_n_4;
  uint64_t *t2_3;
  uint64_t *ctx_n1_3;
  uint64_t *t11_3;
  uint64_t *ctx_n_3;
  uint64_t *t2_2;
  uint64_t *ctx_n1_2;
  uint64_t *t11_2;
  uint64_t *ctx_n_2;
  uint64_t *t2_1;
  uint64_t *ctx_n1_1;
  uint64_t *t11_1;
  uint64_t *ctx_n_1;
  uint64_t *t2;
  uint64_t *ctx_n1;
  uint64_t *t11;
  uint64_t *puStack_100;
  uint32_t i_1;
  uint64_t *ctx_r20;
  uint64_t *ctx_n0_2;
  uint64_t *t1;
  uint64_t *t0;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  uint32_t local_bc;
  uint64_t *puStack_b8;
  uint32_t bLen;
  uint64_t *ctx_n0;
  uint64_t *ctx_n0_1;
  uint64_t bit;
  uint64_t tmp;
  uint local_90;
  uint32_t j;
  uint32_t i1;
  uint32_t i;
  uint64_t *ctx_r2;
  uint64_t *ctx_n;
  unsigned_long __vla_expr1;
  ulong local_68;
  unsigned_long __vla_expr0;
  ulong local_58;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1;
  uint32_t len1;
  uint64_t *resM_local;
  uint64_t *b_local;
  uint32_t bBits_local;
  uint64_t *aM_local;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k_local;
  
  uStack_2b0 = 0x2f0b57;
  k1.r2._4_4_ = Hacl_GenericField64_field_get_len(k);
  local_58 = *(ulong *)k;
  k1._0_8_ = k->n;
  k1.n = (uint64_t *)k->mu;
  k1.mu = (uint64_t)k->r2;
  if (0x1fffffffffffffff < (local_58 & 0xffffffff)) {
    uStack_2b0 = 0x2f0ba9;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField64.c"
           ,0x1c0);
    uStack_2b0 = 0x2f0bb3;
    exit(0xfd);
  }
  local_68 = local_58 & 0xffffffff;
  lVar1 = -(local_68 * 8 + 0xf & 0xfffffffffffffff0);
  puVar12 = (uint64_t *)((long)&uStack_2a8 + lVar1);
  uVar7 = local_58 & 0xffffffff;
  local_278 = puVar12;
  __vla_expr0 = (unsigned_long)&uStack_2a8;
  *(undefined8 *)((long)&uStack_2b0 + lVar1) = 0x2f0bef;
  memset(puVar12,0,uVar7 << 3);
  puVar10 = local_278;
  uVar7 = local_58 & 0xffffffff;
  *(undefined8 *)((long)&uStack_2b0 + lVar1) = 0x2f0c08;
  memcpy(puVar10,aM,uVar7 << 3);
  if (bBits < 200) {
    if (0x1fffffffffffffff < (ulong)(k1.r2._4_4_ * 2)) {
      *(undefined8 *)((long)&uStack_2b0 + lVar1) = 0x2f0c48;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField64.c"
             ,0x1c6);
      *(undefined8 *)((long)&uStack_2b0 + lVar1) = 0x2f0c52;
      exit(0xfd);
    }
    ctx_n = (uint64_t *)(ulong)(k1.r2._4_4_ * 2);
    puVar9 = puVar12 + -(long)ctx_n;
    uVar5 = k1.r2._4_4_ * 2;
    local_280 = puVar9;
    __vla_expr1 = (unsigned_long)puVar12;
    puVar9[-1] = 0x2f0c97;
    memset(puVar9,0,(ulong)uVar5 << 3);
    uVar3 = k1._0_8_;
    puVar10 = local_280;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar9[-1] = 0x2f0cb0;
    memcpy(puVar10,(void *)uVar3,uVar7 << 3);
    uVar4 = k1.mu;
    puVar10 = local_280 + k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar9[-1] = 0x2f0cd3;
    memcpy(puVar10,(void *)uVar4,uVar7 << 3);
    uVar5 = k1.r2._4_4_;
    puVar12 = k1.n;
    puVar10 = local_280;
    ctx_r2 = local_280;
    puVar11 = local_280 + k1.r2._4_4_;
    _i1 = puVar11;
    puVar9[-1] = 0x2f0d04;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar5,puVar10,(uint64_t)puVar12,puVar11,resM);
    for (j = 0; uVar2 = k1.r2._4_4_, puVar11 = k1.n, puVar12 = local_278, puVar10 = local_280,
        j < bBits; j = j + 1) {
      local_90 = j >> 6;
      tmp._4_4_ = j & 0x3f;
      bit = b[local_90];
      ctx_n0_1 = (uint64_t *)(bit >> (sbyte)tmp._4_4_ & 1);
      if (ctx_n0_1 != (uint64_t *)0x0) {
        ctx_n0 = local_280;
        puVar9[-1] = 0x2f0da5;
        Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar10,(uint64_t)puVar11,resM,puVar12,resM);
      }
      uVar2 = k1.r2._4_4_;
      puVar11 = k1.n;
      puVar12 = local_278;
      puVar10 = local_280;
      puStack_b8 = local_280;
      puVar9[-1] = 0x2f0dd0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar10,(uint64_t)puVar11,puVar12,puVar12);
    }
  }
  else {
    if (bBits == 0) {
      local_bc = 1;
    }
    else {
      local_bc = (bBits - 1 >> 6) + 1;
    }
    if (0x1fffffffffffffff < (ulong)(k1.r2._4_4_ * 2)) {
      *(undefined8 *)((long)&uStack_2b0 + lVar1) = 0x2f0e47;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField64.c"
             ,0x1e8);
      *(undefined8 *)((long)&uStack_2b0 + lVar1) = 0x2f0e51;
      exit(0xfd);
    }
    __vla_expr3 = (unsigned_long)(k1.r2._4_4_ * 2);
    puVar11 = puVar12 + -__vla_expr3;
    uVar5 = k1.r2._4_4_ * 2;
    local_288 = puVar11;
    __vla_expr2 = (unsigned_long)puVar12;
    puVar11[-1] = 0x2f0e9c;
    memset(puVar11,0,(ulong)uVar5 << 3);
    uVar3 = k1._0_8_;
    puVar10 = local_288;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f0eb5;
    memcpy(puVar10,(void *)uVar3,uVar7 << 3);
    uVar4 = k1.mu;
    puVar10 = local_288 + k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f0ed8;
    memcpy(puVar10,(void *)uVar4,uVar7 << 3);
    if (0x1fffffffffffffff < (ulong)(k1.r2._4_4_ << 4)) {
      puVar11[-1] = 0x2f0f09;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField64.c"
             ,0x1ed);
      puVar11[-1] = 0x2f0f13;
      exit(0xfd);
    }
    __vla_expr4 = (unsigned_long)(k1.r2._4_4_ << 4);
    puVar11 = puVar11 + -__vla_expr4;
    uVar5 = k1.r2._4_4_ << 4;
    local_290 = puVar11;
    puVar11[-1] = 0x2f0f50;
    memset(puVar11,0,(ulong)uVar5 << 3);
    if (0x1fffffffffffffff < (ulong)k1.r2._4_4_) {
      puVar11[-1] = 0x2f0f7c;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField64.c"
             ,0x1f0);
      puVar11[-1] = 0x2f0f86;
      exit(0xfd);
    }
    t0 = (uint64_t *)(ulong)k1.r2._4_4_;
    puVar11 = (uint64_t *)((long)puVar11 - ((long)t0 * 8 + 0xfU & 0xfffffffffffffff0));
    uVar7 = (ulong)k1.r2._4_4_;
    local_298 = puVar11;
    puVar11[-1] = 0x2f0fc0;
    memset(puVar11,0,uVar7 << 3);
    uVar5 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_290;
    t1 = local_290;
    ctx_n0_2 = local_290 + k1.r2._4_4_;
    ctx_r20 = local_288;
    puVar6 = local_288 + k1.r2._4_4_;
    puStack_100 = puVar6;
    puVar11[-1] = 0x2f101f;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar5,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar12 = ctx_n0_2;
    puVar10 = local_278;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f103b;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_298;
    t11._4_4_ = 0;
    puVar6 = local_290 + k1.r2._4_4_;
    t2 = local_288;
    ctx_n1 = puVar6;
    puVar11[-1] = 0x2f1098;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f10cc;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar6 = k1.n;
    puVar9 = local_278;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar8 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_1 = local_288;
    ctx_n_1 = puVar8;
    puVar11[-1] = 0x2f1128;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar6,puVar9,puVar8,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f115c;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar6 = local_290 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_1 = local_288;
    ctx_n1_1 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar11[-1] = 0x2f11be;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f11f2;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar6 = k1.n;
    puVar9 = local_278;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar8 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_2 = local_288;
    ctx_n_2 = puVar8;
    puVar11[-1] = 0x2f124e;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar6,puVar9,puVar8,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f1282;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar6 = local_290 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_2 = local_288;
    ctx_n1_2 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar11[-1] = 0x2f12e4;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f1318;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar6 = k1.n;
    puVar9 = local_278;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar8 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_3 = local_288;
    ctx_n_3 = puVar8;
    puVar11[-1] = 0x2f1374;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar6,puVar9,puVar8,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f13a8;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar6 = local_290 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_3 = local_288;
    ctx_n1_3 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar11[-1] = 0x2f140a;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f143e;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar6 = k1.n;
    puVar9 = local_278;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar8 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_4 = local_288;
    ctx_n_4 = puVar8;
    puVar11[-1] = 0x2f149a;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar6,puVar9,puVar8,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f14ce;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar6 = local_290 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_4 = local_288;
    ctx_n1_4 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar11[-1] = 0x2f1530;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f1564;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar6 = k1.n;
    puVar9 = local_278;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar8 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_5 = local_288;
    ctx_n_5 = puVar8;
    puVar11[-1] = 0x2f15c0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar6,puVar9,puVar8,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f15f4;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar6 = local_290 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_5 = local_288;
    ctx_n1_5 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar11[-1] = 0x2f1656;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f168a;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar6 = k1.n;
    puVar9 = local_278;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar8 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    t11_6 = local_288;
    ctx_n_6 = puVar8;
    puVar11[-1] = 0x2f16e6;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar6,puVar9,puVar8,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f171a;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar9 = k1.n;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar6 = local_290 + (t11._4_4_ + 2) * k1.r2._4_4_;
    t2_6 = local_288;
    ctx_n1_6 = puVar6;
    t11._4_4_ = t11._4_4_ + 1;
    puVar11[-1] = 0x2f177c;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar12,(uint64_t)puVar9,puVar6,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f17b0;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar2 = k1.r2._4_4_;
    puVar6 = k1.n;
    puVar9 = local_278;
    puVar12 = local_288;
    puVar10 = local_298;
    puVar8 = local_290 + (t11._4_4_ * 2 + 2) * k1.r2._4_4_;
    puStack_1e8 = local_288;
    ctx_n_7 = puVar8;
    puVar11[-1] = 0x2f180c;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar6,puVar9,puVar8,puVar10);
    puVar10 = local_298;
    puVar12 = local_290 + (t11._4_4_ * 2 + 3) * k1.r2._4_4_;
    uVar7 = (ulong)k1.r2._4_4_;
    puVar11[-1] = 0x2f1840;
    memcpy(puVar12,puVar10,uVar7 << 3);
    uVar5 = k1.r2._4_4_;
    puVar12 = k1.n;
    uVar2 = local_bc;
    puVar10 = local_288;
    t11._4_4_ = t11._4_4_ + 1;
    if ((bBits & 3) == 0) {
      ctx_r2_1 = local_288;
      puVar9 = local_288 + k1.r2._4_4_;
      __vla_expr5 = (unsigned_long)puVar9;
      puVar11[-1] = 0x2f1915;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar5,puVar10,(uint64_t)puVar12,puVar9,resM);
    }
    else {
      bits_c._4_4_ = bBits & 0xfffffffc;
      puVar11[-1] = 0x2f1885;
      uStack_1f8 = Hacl_Bignum_Lib_bn_get_bits_u64(uVar2,b,bBits & 0xfffffffc,4);
      a_bits_l._4_4_ = (int)uStack_1f8;
      puVar10 = local_290 + a_bits_l._4_4_ * k1.r2._4_4_;
      uVar7 = (ulong)k1.r2._4_4_;
      ctx_n_8 = puVar10;
      puVar11[-1] = 0x2f18d6;
      memcpy(resM,puVar10,uVar7 << 3);
    }
    if (0x1fffffffffffffff < (ulong)k1.r2._4_4_) {
      puVar11[-1] = 0x2f1943;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_GenericField64.c"
             ,0x213);
      puVar11[-1] = 0x2f194d;
      exit(0xfd);
    }
    _i0 = (ulong)k1.r2._4_4_;
    puVar11 = (uint64_t *)((long)puVar11 - (_i0 * 8 + 0xf & 0xfffffffffffffff0));
    uVar7 = (ulong)k1.r2._4_4_;
    local_2a0 = puVar11;
    puVar11[-1] = 0x2f1987;
    memset(puVar11,0,uVar7 << 3);
    for (ctx_n_10._4_4_ = 0; uVar2 = k1.r2._4_4_, puVar12 = k1.n, puVar10 = local_288,
        ctx_n_10._4_4_ < bBits >> 2; ctx_n_10._4_4_ = ctx_n_10._4_4_ + 1) {
      ctx_n_10._0_4_ = 0;
      ctx_n_11 = local_288;
      puVar11[-1] = 0x2f19da;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar10,(uint64_t)puVar12,resM,resM);
      uVar2 = k1.r2._4_4_;
      puVar12 = k1.n;
      puVar10 = local_288;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_12 = local_288;
      puVar11[-1] = 0x2f1a12;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar10,(uint64_t)puVar12,resM,resM);
      uVar2 = k1.r2._4_4_;
      puVar12 = k1.n;
      puVar10 = local_288;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_13 = local_288;
      puVar11[-1] = 0x2f1a4a;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar10,(uint64_t)puVar12,resM,resM);
      uVar2 = k1.r2._4_4_;
      puVar12 = k1.n;
      puVar10 = local_288;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      puStack_248 = local_288;
      puVar11[-1] = 0x2f1a82;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar2,puVar10,(uint64_t)puVar12,resM,resM);
      uVar2 = local_bc;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      i_00 = ((bBits - (bBits & 3)) + ctx_n_10._4_4_ * -4) - 4;
      bits_l._4_4_ = i_00;
      puVar11[-1] = 0x2f1acc;
      uStack_258 = Hacl_Bignum_Lib_bn_get_bits_u64(uVar2,b,i_00,4);
      puVar10 = local_2a0;
      a_bits_l_1._4_4_ = (int)uStack_258;
      puVar12 = local_290 + a_bits_l_1._4_4_ * k1.r2._4_4_;
      uVar7 = (ulong)k1.r2._4_4_;
      ctx_n_9 = puVar12;
      puVar11[-1] = 0x2f1b20;
      memcpy(puVar10,puVar12,uVar7 << 3);
      uVar2 = k1.r2._4_4_;
      puVar9 = k1.n;
      puVar12 = local_288;
      puVar10 = local_2a0;
      local_270 = local_288;
      puVar11[-1] = 0x2f1b50;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar2,puVar12,(uint64_t)puVar9,resM,puVar10,resM);
    }
  }
  return;
}

Assistant:

void
Hacl_GenericField64_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,
  uint64_t *aM,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *resM
)
{
  uint32_t len1 = Hacl_GenericField64_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint64_t), k1.len);
  uint64_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint64_t));
  memcpy(aMc, aM, k1.len * sizeof (uint64_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 64U;
      uint32_t j = i % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      if (!(bit == 0ULL))
      {
        uint64_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint64_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 64U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len1);
    uint64_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint64_t));
    uint64_t *t0 = table;
    uint64_t *t1 = table + len1;
    uint64_t *ctx_n0 = ctx;
    uint64_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint64_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint64_t *t11 = table + (i + 1U) * len1;
      uint64_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint64_t));
      uint64_t *t2 = table + (2U * i + 2U) * len1;
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint64_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i, 4U);
      uint32_t bits_l32 = (uint32_t)bits_c;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
    }
    else
    {
      uint64_t *ctx_n = ctx;
      uint64_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint64_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint64_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k2, 4U);
      uint32_t bits_l32 = (uint32_t)bits_l;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}